

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTreeForwardSubsumptionAndResolution.cpp
# Opt level: O3

bool __thiscall
Inferences::CodeTreeForwardSubsumptionAndResolution::perform
          (CodeTreeForwardSubsumptionAndResolution *this,Clause *cl,Clause **replacement,
          ClauseIterator *premises)

{
  int *piVar1;
  long *plVar2;
  Literal *pLVar3;
  Clause *pCVar4;
  Literal **ppLVar5;
  Clause *unit;
  InferenceExtra *extra;
  ulong uVar6;
  ulong uVar7;
  int resolvedQueryLit;
  uint local_b0;
  uint local_ac;
  Stack<Kernel::Literal_*> local_a8;
  ClauseIterator *local_80;
  SimplifyingInference2 local_78;
  Inference local_60;
  
  if ((this->_ct->super_CodeTree)._entryPoint == (CodeBlock *)0x0) {
    uVar7 = 0;
  }
  else {
    local_80 = premises;
    if (perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)::cm == '\0'
       ) {
      perform();
    }
    Indexing::ClauseCodeTree::ClauseMatcher::init(&perform::cm,(EVP_PKEY_CTX *)this->_ct);
    pCVar4 = Indexing::ClauseCodeTree::ClauseMatcher::next(&perform::cm,(int *)&local_b0);
    uVar7 = CONCAT71(0xb4ed,pCVar4 != (Clause *)0x0);
    if (pCVar4 != (Clause *)0x0) {
      if (local_b0 != 0xffffffff) {
        local_ac = (uint)uVar7;
        local_a8._cursor = (Literal **)0x0;
        local_a8._end = (Literal **)0x0;
        local_a8._capacity = 0;
        local_a8._stack = (Literal **)0x0;
        uVar7 = *(ulong *)&cl->field_0x38;
        if ((uVar7 & 0xfffff) != 0) {
          ppLVar5 = (Literal **)0x0;
          uVar6 = 0;
          do {
            if (uVar6 != local_b0) {
              pLVar3 = cl->_literals[uVar6];
              if (ppLVar5 == local_a8._end) {
                Lib::Stack<Kernel::Literal_*>::expand(&local_a8);
                ppLVar5 = local_a8._cursor;
              }
              *ppLVar5 = pLVar3;
              ppLVar5 = local_a8._cursor + 1;
              uVar7 = *(ulong *)&cl->field_0x38;
              local_a8._cursor = ppLVar5;
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < ((uint)uVar7 & 0xfffff));
        }
        local_78.rule = SUBSUMPTION_RESOLUTION;
        local_78.premise1 = cl;
        local_78.premise2 = pCVar4;
        Kernel::Inference::Inference(&local_60,&local_78);
        unit = Kernel::Clause::fromStack(&local_a8,&local_60);
        *replacement = unit;
        uVar7 = (ulong)local_ac;
        if (*(int *)(Lib::env + 0x85a8) == 2) {
          extra = (InferenceExtra *)::operator_new(0x10);
          pLVar3 = cl->_literals[(int)local_b0];
          extra->_vptr_InferenceExtra = (_func_int **)&PTR__InferenceExtra_00b3a5a0;
          extra[1]._vptr_InferenceExtra = (_func_int **)pLVar3;
          Lib::ProofExtra::insert((ProofExtra *)&DAT_00b521d8,&unit->super_Unit,extra);
        }
        local_78._0_8_ =
             Lib::FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
        ((IteratorCore<Kernel::Clause_*> *)local_78._0_8_)->_vptr_IteratorCore =
             (_func_int **)&PTR__IteratorCore_00b37428;
        *(undefined1 *)
         &((IteratorCore<Kernel::Clause_*> *)(local_78._0_8_ + 0x10))->_vptr_IteratorCore = 0;
        *(Clause **)(local_78._0_8_ + 0x10 + 8) = pCVar4;
        ((IteratorCore<Kernel::Clause_*> *)local_78._0_8_)->_refCnt = 1;
        Lib::VirtualIterator<Kernel::Clause_*>::operator=
                  (local_80,(VirtualIterator<Kernel::Clause_*> *)&local_78);
        if ((IteratorCore<Kernel::Clause_*> *)local_78._0_8_ !=
            (IteratorCore<Kernel::Clause_*> *)0x0) {
          piVar1 = (int *)(local_78._0_8_ + 8);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            (**(code **)(*(long *)local_78._0_8_ + 8))();
          }
        }
        *(int *)(DAT_00b521c0 + 0x140) = *(int *)(DAT_00b521c0 + 0x140) + 1;
        Indexing::ClauseCodeTree::ClauseMatcher::reset(&perform::cm);
        if (local_a8._stack != (Literal **)0x0) {
          uVar6 = local_a8._capacity * 8 + 0xf & 0xfffffffffffffff0;
          if (uVar6 == 0) {
            *local_a8._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_a8._stack;
          }
          else if (uVar6 < 0x11) {
            *local_a8._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_a8._stack;
          }
          else if (uVar6 < 0x19) {
            *local_a8._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_a8._stack;
          }
          else if (uVar6 < 0x21) {
            *local_a8._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_a8._stack;
          }
          else if (uVar6 < 0x31) {
            *local_a8._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_a8._stack;
          }
          else if (uVar6 < 0x41) {
            *local_a8._stack = (Literal *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_a8._stack;
          }
          else {
            operator_delete(local_a8._stack,0x10);
          }
        }
        goto LAB_004b9349;
      }
      local_a8._capacity =
           (size_t)Lib::FixedSizeAllocator<32UL>::alloc
                             ((FixedSizeAllocator<32UL> *)
                              (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
      *(undefined ***)local_a8._capacity = &PTR__IteratorCore_00b37428;
      *(undefined1 *)(local_a8._capacity + 0x10) = 0;
      *(Clause **)(local_a8._capacity + 0x18) = pCVar4;
      *(undefined4 *)(local_a8._capacity + 8) = 1;
      Lib::VirtualIterator<Kernel::Clause_*>::operator=
                (local_80,(VirtualIterator<Kernel::Clause_*> *)&local_a8);
      if ((long *)local_a8._capacity != (long *)0x0) {
        plVar2 = (long *)(local_a8._capacity + 8);
        *(int *)plVar2 = (int)*plVar2 + -1;
        if ((int)*plVar2 == 0) {
          (**(code **)(*(long *)local_a8._capacity + 8))();
        }
      }
      *(int *)(DAT_00b521c0 + 0x1b4) = *(int *)(DAT_00b521c0 + 0x1b4) + 1;
    }
    Indexing::ClauseCodeTree::ClauseMatcher::reset(&perform::cm);
  }
LAB_004b9349:
  return SUB81(uVar7,0);
}

Assistant:

bool CodeTreeForwardSubsumptionAndResolution::perform(Clause *cl, Clause *&replacement, ClauseIterator &premises)
{
  if (_ct->isEmpty()) {
    return false;
  }

  static ClauseCodeTree::ClauseMatcher cm;

  cm.init(_ct, cl, _subsumptionResolution);

  Clause* premise;
  int resolvedQueryLit;

  while ((premise = cm.next(resolvedQueryLit))) {
    if (resolvedQueryLit == -1) {
      ASS(satSubs.checkSubsumption(premise, cl));
      premises = pvi(getSingletonIterator(premise));
      env.statistics->forwardSubsumed++;
      cm.reset();
      return true;
    }
    ASS(satSubs.checkSubsumptionResolutionWithLiteral(premise, cl, resolvedQueryLit));

    LiteralStack res;
    for (unsigned i = 0; i < cl->length(); i++) {
      if (i == (unsigned)resolvedQueryLit) {
        continue;
      }
      res.push((*cl)[i]);
    }
    replacement = Clause::fromStack(res, SimplifyingInference2(InferenceRule::SUBSUMPTION_RESOLUTION, cl, premise));
    if(env.options->proofExtra() == Options::ProofExtra::FULL)
      env.proofExtra.insert(replacement, new LiteralInferenceExtra((*cl)[resolvedQueryLit]));
    premises = pvi(getSingletonIterator(premise));
    env.statistics->forwardSubsumptionResolution++;
    cm.reset();
    return true;
  }

  cm.reset();
  return false;
}